

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty_printer.hpp
# Opt level: O0

void __thiscall trial::protocol::json::example::pretty_printer::print_value(pretty_printer *this)

{
  basic_writer<char,_16UL> *this_00;
  value vVar1;
  view_type local_20;
  pretty_printer *local_10;
  pretty_printer *this_local;
  
  local_10 = this;
  vVar1 = basic_reader<char>::symbol(this->reader);
  if (vVar1 - begin_array < 4) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/example/json/pretty_printer/pretty_printer.hpp"
                  ,0xca,"void trial::protocol::json::example::pretty_printer::print_value()");
  }
  this_00 = this->writer;
  local_20 = basic_reader<char>::literal(this->reader);
  basic_writer<char,_16UL>::literal(this_00,&local_20);
  return;
}

Assistant:

void print_value()
    {
        switch (reader.symbol())
        {
        case json::token::symbol::begin_array:
        case json::token::symbol::end_array:
        case json::token::symbol::begin_object:
        case json::token::symbol::end_object:
            assert(false);
            break;

        default:
            writer.literal(reader.literal());
            break;
        }
    }